

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cpp
# Opt level: O2

void __thiscall unittest::UnitTest::TestGetValue(UnitTest *this)

{
  bool bVar1;
  mapped_type *sec;
  int b;
  int local_210;
  int c;
  int a;
  Ini<char> ini;
  istringstream ss;
  
  inipp::Ini<char>::Ini(&ini);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"[sec1]\na=2\nb=bla",(allocator<char> *)&b);
  std::__cxx11::istringstream::istringstream((istringstream *)&ss,(string *)&a,_S_in);
  std::__cxx11::string::~string((string *)&a);
  inipp::Ini<char>::parse(&ini,(basic_istream<char,_std::char_traits<char>_> *)&ss);
  WriteMessage<char>(&ini);
  std::__cxx11::string::string<std::allocator<char>>((string *)&a,"sec1",(allocator<char> *)&b);
  sec = std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
        ::at(&ini.sections,(key_type *)&a);
  std::__cxx11::string::~string((string *)&a);
  a = 4;
  b = 7;
  c = 10;
  bVar1 = inipp::get_value<char,int>(sec,"a",&a);
  Assert::IsTrue(bVar1);
  local_210 = 2;
  Assert::AreEqual<int>(&a,&local_210);
  bVar1 = inipp::get_value<char,int>(sec,"b",&b);
  Assert::IsFalse(bVar1);
  local_210 = 7;
  Assert::AreEqual<int>(&b,&local_210);
  bVar1 = inipp::get_value<char,int>(sec,"c",&c);
  Assert::IsFalse(bVar1);
  local_210 = 10;
  Assert::AreEqual<int>(&c,&local_210);
  std::__cxx11::istringstream::~istringstream((istringstream *)&ss);
  inipp::Ini<char>::~Ini(&ini);
  return;
}

Assistant:

TEST_METHOD(TestGetValue)
		{
			Ini<char> ini;
			std::istringstream ss("[sec1]\na=2\nb=bla");
			ini.parse(ss);
			WriteMessage(ini);
			const auto & sec = ini.sections.at("sec1");
			int a = 4;
			int b = 7;
			int c = 10;
			Assert::IsTrue(get_value(sec, "a", a));
			Assert::AreEqual(a, 2);
			Assert::IsFalse(get_value(sec, "b", b));
			Assert::AreEqual(b, 7);
			Assert::IsFalse(get_value(sec, "c", c));
			Assert::AreEqual(c, 10);
		}